

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clistats.cpp
# Opt level: O1

bool __thiscall MultivariateTracker::update(MultivariateTracker *this,DataVector *data)

{
  double dVar1;
  double dVar2;
  pointer pDVar3;
  pointer pdVar4;
  uint uVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  pointer pSVar9;
  ulong uVar10;
  double *pdVar11;
  pointer pSVar12;
  double dVar13;
  double dVar14;
  
  pSVar12 = (this->_statistics).
            super__Vector_base<StatisticsTracker,_std::allocator<StatisticsTracker>_>._M_impl.
            super__Vector_impl_data._M_start;
  pSVar9 = (this->_statistics).
           super__Vector_base<StatisticsTracker,_std::allocator<StatisticsTracker>_>._M_impl.
           super__Vector_impl_data._M_finish;
  lVar7 = (long)pSVar9 - (long)pSVar12;
  if (lVar7 != 0) {
    if ((long)(data->super_vector<DataPoint,_std::allocator<DataPoint>_>).
              super__Vector_base<DataPoint,_std::allocator<DataPoint>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(data->super_vector<DataPoint,_std::allocator<DataPoint>_>).
              super__Vector_base<DataPoint,_std::allocator<DataPoint>_>._M_impl.
              super__Vector_impl_data._M_start >> 4 != (lVar7 >> 3) * 0x34f72c234f72c235) {
      return false;
    }
    if (pSVar9 != pSVar12) goto LAB_0018647c;
  }
  lVar7 = (long)(data->super_vector<DataPoint,_std::allocator<DataPoint>_>).
                super__Vector_base<DataPoint,_std::allocator<DataPoint>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(data->super_vector<DataPoint,_std::allocator<DataPoint>_>).
                super__Vector_base<DataPoint,_std::allocator<DataPoint>_>._M_impl.
                super__Vector_impl_data._M_start;
  if (lVar7 == 0) {
    return false;
  }
  initialize(this,lVar7 >> 4,&this->_options);
LAB_0018647c:
  if ((this->_options).doCov == true) {
    pDVar3 = (data->super_vector<DataPoint,_std::allocator<DataPoint>_>).
             super__Vector_base<DataPoint,_std::allocator<DataPoint>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar5 = (uint)((ulong)((long)(data->super_vector<DataPoint,_std::allocator<DataPoint>_>).
                                 super__Vector_base<DataPoint,_std::allocator<DataPoint>_>._M_impl.
                                 super__Vector_impl_data._M_finish - (long)pDVar3) >> 4);
    if (0 < (int)uVar5) {
      pSVar12 = (this->_statistics).
                super__Vector_base<StatisticsTracker,_std::allocator<StatisticsTracker>_>._M_impl.
                super__Vector_impl_data._M_start;
      uVar6 = (ulong)(uVar5 & 0x7fffffff);
      lVar7 = 0;
      uVar8 = 0;
      do {
        if (pDVar3[uVar8].active == true) {
          dVar1 = pDVar3[uVar8].value;
          dVar2 = pSVar12[uVar8]._mean;
          dVar13 = (double)((int)pSVar12[uVar8]._count + 1);
          pdVar4 = (this->_covariance).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          uVar10 = 0;
          pSVar9 = pSVar12;
          pdVar11 = &pDVar3->value;
          do {
            if (((DataPoint *)(pdVar11 + -1))->active == true) {
              dVar14 = (double)((int)pSVar9->_count + 1);
              if (dVar14 <= dVar13) {
                dVar14 = dVar13;
              }
              *(double *)((long)pdVar4 + uVar10 * 8 + lVar7) =
                   (((dVar14 + -1.0) / dVar14) * (dVar1 - dVar2) * (*pdVar11 - pSVar9->_mean) +
                   *(double *)((long)pdVar4 + uVar10 * 8 + lVar7) * (dVar14 + -1.0)) / dVar14;
            }
            uVar10 = uVar10 + 1;
            pdVar11 = pdVar11 + 2;
            pSVar9 = pSVar9 + 1;
          } while (uVar6 != uVar10);
        }
        uVar8 = uVar8 + 1;
        lVar7 = lVar7 + uVar6 * 8;
      } while (uVar8 != uVar6);
    }
  }
  pSVar12 = (this->_statistics).
            super__Vector_base<StatisticsTracker,_std::allocator<StatisticsTracker>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (pSVar12 !=
      (this->_statistics).super__Vector_base<StatisticsTracker,_std::allocator<StatisticsTracker>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    pdVar11 = &((data->super_vector<DataPoint,_std::allocator<DataPoint>_>).
                super__Vector_base<DataPoint,_std::allocator<DataPoint>_>._M_impl.
                super__Vector_impl_data._M_start)->value;
    do {
      if (((DataPoint *)(pdVar11 + -1))->active == true) {
        StatisticsTracker::update(pSVar12,*pdVar11);
      }
      pSVar12 = pSVar12 + 1;
      pdVar11 = pdVar11 + 2;
    } while (pSVar12 !=
             (this->_statistics).
             super__Vector_base<StatisticsTracker,_std::allocator<StatisticsTracker>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  return true;
}

Assistant:

bool
    update(DataVector const & data)
    {

        // Check data dimensions matches tracker dimensions
        if (this->_statistics.size() != 0 && data.size() != this->_statistics.size())
        {
            return false;
        }

        // Try to initialize the tracker
        if (this->_statistics.size() == 0)
        {
            if (data.size() == 0) return false;
            this->initialize(data.size(), this->_options);
        }

        if (this->_options.doCov)
        {

            // Update covariance
            const int numPoints = data.size();
            for (int i = 0; i < numPoints; i++)
            {
            
                if (!data[i].active) continue;

                int countI = this->_statistics[i].getCount();
                double meanI = this->_statistics[i].getMean();
                double deltaI = (data[i].value - meanI);

                for (int j = 0; j < numPoints; j++)
                {

                    if (!data[j].active) continue;
                
                    int countJ = this->_statistics[j].getCount();
                    double meanJ = this->_statistics[j].getMean();
                    double deltaJ = (data[j].value - meanJ);

                    // Conservative estimate the number of data points
                    double N = std::max<double>(countI+1, countJ+1);

                    int k = i * numPoints + j;
                    this->_covariance[k] *= (N-1);
                    this->_covariance[k] += ((N-1)/N) * (deltaI) * (deltaJ);
                    this->_covariance[k] /= N;

                }
            }

        }

        // Update statistics with each data point
        DataVector::const_iterator datum = data.begin();
        std::vector<StatisticsTracker>::iterator tracker = this->_statistics.begin();
        for ( ; tracker != this->_statistics.end(); ++tracker, ++datum)
        {
            if (datum->active) tracker->update(datum->value);
        }

        return true;
        
    }